

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_p_h_m_weighted_by_squared_diag_distance.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *filename;
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  uint dimension;
  long lVar4;
  value_type *__x;
  bool bVar5;
  double min_;
  double max_;
  double dVar6;
  vector<const_char_*,_std::allocator<const_char_*>_> filenames;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  filter;
  char *local_288 [4];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_268;
  Persistence_heat_maps l;
  stringstream ss;
  ostream local_1a8 [376];
  
  poVar3 = std::operator<<((ostream *)&std::clog,
                           "This program creates persistence heat map files (*.mps) of persistence diagrams files (*.pers) "
                          );
  poVar3 = std::operator<<(poVar3,
                           "provided as an input.The Gaussian kernels are weighted by the square of distance of a center from the "
                          );
  poVar3 = std::operator<<(poVar3,"diagonal.\n");
  poVar3 = std::operator<<(poVar3,
                           "The first parameter of a program is an integer, a size of a grid.\n");
  poVar3 = std::operator<<(poVar3,
                           "The second and third parameters are min and max of the grid. If you want those numbers to be computed "
                          );
  poVar3 = std::operator<<(poVar3,"based on the data, set them both to -1 \n");
  poVar3 = std::operator<<(poVar3,
                           "The fourth parameter is an integer, the standard deviation of a Gaussian kernel expressed in a number "
                          );
  poVar3 = std::operator<<(poVar3,"of pixels.\n");
  poVar3 = std::operator<<(poVar3,
                           "The fifth parameter of this program is a dimension of persistence that will be used in creation of "
                          );
  poVar3 = std::operator<<(poVar3,"the persistence heat maps.");
  poVar3 = std::operator<<(poVar3,
                           "If your input files contains persistence pairs of various dimension, as a fifth parameter of the "
                          );
  poVar3 = std::operator<<(poVar3,
                           "procedure please provide the dimension of persistence you want to use.")
  ;
  poVar3 = std::operator<<(poVar3,
                           "If in your files there are only birth-death pairs of the same dimension, set the fifth parameter to "
                          );
  poVar3 = std::operator<<(poVar3,"-1.\n");
  std::operator<<(poVar3,
                  "The remaining parameters are the names of files with persistence diagrams. \n");
  if (argc < 7) {
    std::operator<<((ostream *)&std::clog,"Wrong parameter list, the program will now terminate \n")
    ;
    iVar1 = 1;
  }
  else {
    iVar1 = atoi(argv[1]);
    min_ = atof(argv[2]);
    max_ = atof(argv[3]);
    dVar6 = atof(argv[4]);
    uVar2 = atoi(argv[5]);
    dimension = 0xffffffff;
    if (-1 < (int)uVar2) {
      dimension = uVar2;
    }
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar4 = (ulong)(uint)argc - 6;
    __x = argv + 6;
    while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back(&filenames,__x);
      __x = __x + 1;
    }
    Gudhi::Persistence_representations::create_Gaussian_filter
              (&filter,(long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6,1.0
              );
    for (lVar4 = 0;
        lVar4 != (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3; lVar4 = lVar4 + 1) {
      poVar3 = std::operator<<((ostream *)&std::clog,"Creating a heat map based on a file : ");
      poVar3 = std::operator<<(poVar3,filenames.
                                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::endl<char,std::char_traits<char>>(poVar3);
      filename = filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(&local_268,&filter);
      Gudhi::Persistence_representations::
      Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
      ::Persistence_heat_maps(&l,filename,&local_268,false,(long)iVar1,min_,max_,dimension);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_268);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_1a8,
                               filenames.
                               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar4]);
      std::operator<<(poVar3,".mps");
      std::__cxx11::stringbuf::str();
      Gudhi::Persistence_representations::
      Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
      ::print_to_file(&l,local_288[0]);
      std::__cxx11::string::~string((string *)local_288);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      Gudhi::Persistence_representations::
      Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
      ::~Persistence_heat_maps(&l);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&filter);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&filenames.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
  std::clog << "This program creates persistence heat map files (*.mps) of persistence diagrams files (*.pers) "
            << "provided as an input.The Gaussian kernels are weighted by the square of distance of a center from the "
            << "diagonal.\n"
            << "The first parameter of a program is an integer, a size of a grid.\n"
            << "The second and third parameters are min and max of the grid. If you want those numbers to be computed "
            << "based on the data, set them both to -1 \n"
            << "The fourth parameter is an integer, the standard deviation of a Gaussian kernel expressed in a number "
            << "of pixels.\n"
            << "The fifth parameter of this program is a dimension of persistence that will be used in creation of "
            << "the persistence heat maps."
            << "If your input files contains persistence pairs of various dimension, as a fifth parameter of the "
            << "procedure please provide the dimension of persistence you want to use."
            << "If in your files there are only birth-death pairs of the same dimension, set the fifth parameter to "
            << "-1.\n"
            << "The remaining parameters are the names of files with persistence diagrams. \n";

  if (argc < 7) {
    std::clog << "Wrong parameter list, the program will now terminate \n";
    return 1;
  }

  size_t size_of_grid = (size_t)atoi(argv[1]);
  double min_ = atof(argv[2]);
  double max_ = atof(argv[3]);
  size_t stdiv = atof(argv[4]);

  unsigned dimension = std::numeric_limits<unsigned>::max();
  int dim = atoi(argv[5]);
  if (dim >= 0) {
    dimension = (unsigned)dim;
  }

  std::vector<const char*> filenames;
  for (int i = 6; i < argc; ++i) {
    filenames.push_back(argv[i]);
  }

  std::vector<std::vector<double> > filter = Gudhi::Persistence_representations::create_Gaussian_filter(stdiv, 1);
  for (size_t i = 0; i != filenames.size(); ++i) {
    std::clog << "Creating a heat map based on a file : " << filenames[i] << std::endl;
    Persistence_heat_maps l(filenames[i], filter, false, size_of_grid, min_, max_, dimension);

    std::stringstream ss;
    ss << filenames[i] << ".mps";
    l.print_to_file(ss.str().c_str());
  }
  return 0;
}